

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall RtMidiIn::RtMidiIn(RtMidiIn *this,Api api,string *clientName,uint queueSizeLimit)

{
  MidiApi *pMVar1;
  int iVar2;
  ostream *poVar3;
  RtMidiError *this_00;
  uint uVar4;
  allocator<char> local_59;
  vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> apis;
  string errorText;
  
  (this->super_RtMidi).rtapi_ = (MidiApi *)0x0;
  (this->super_RtMidi)._vptr_RtMidi = (_func_int **)&PTR_openPort_00111980;
  if (api != UNSPECIFIED) {
    openMidiApi(this,api,clientName,queueSizeLimit);
    if ((this->super_RtMidi).rtapi_ != (MidiApi *)0x0) {
      return;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "\nRtMidiIn: no compiled support for specified API argument!\n\n");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  RtMidi::getCompiledApi(&apis);
  for (uVar4 = 0;
      (ulong)uVar4 <
      (ulong)((long)apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
    openMidiApi(this,apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar4],clientName,queueSizeLimit);
    pMVar1 = (this->super_RtMidi).rtapi_;
    if ((pMVar1 != (MidiApi *)0x0) && (iVar2 = (*pMVar1->_vptr_MidiApi[8])(), iVar2 != 0)) break;
  }
  if ((this->super_RtMidi).rtapi_ != (MidiApi *)0x0) {
    std::_Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>::~_Vector_base
              (&apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&errorText,"RtMidiIn: no compiled API support found ... critical error!!",
             &local_59);
  this_00 = (RtMidiError *)__cxa_allocate_exception(0x30);
  RtMidiError::RtMidiError(this_00,&errorText,UNSPECIFIED);
  __cxa_throw(this_00,&RtMidiError::typeinfo,RtMidiError::~RtMidiError);
}

Assistant:

RTMIDI_DLL_PUBLIC RtMidiIn :: RtMidiIn( RtMidi::Api api, const std::string &clientName, unsigned int queueSizeLimit )
  : RtMidi()
{
  if ( api != UNSPECIFIED ) {
    // Attempt to open the specified API.
    openMidiApi( api, clientName, queueSizeLimit );
    if ( rtapi_ ) return;

    // No compiled support for specified API value.  Issue a warning
    // and continue as if no API was specified.
    std::cerr << "\nRtMidiIn: no compiled support for specified API argument!\n\n" << std::endl;
  }

  // Iterate through the compiled APIs and return as soon as we find
  // one with at least one port or we reach the end of the list.
  std::vector< RtMidi::Api > apis;
  getCompiledApi( apis );
  for ( unsigned int i=0; i<apis.size(); i++ ) {
    openMidiApi( apis[i], clientName, queueSizeLimit );
    if ( rtapi_ && rtapi_->getPortCount() ) break;
  }

  if ( rtapi_ ) return;

  // It should not be possible to get here because the preprocessor
  // definition __RTMIDI_DUMMY__ is automatically defined if no
  // API-specific definitions are passed to the compiler. But just in
  // case something weird happens, we'll throw an error.
  std::string errorText = "RtMidiIn: no compiled API support found ... critical error!!";
  throw( RtMidiError( errorText, RtMidiError::UNSPECIFIED ) );
}